

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
booster::locale::as::details::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,set_domain *dom)

{
  int iVar1;
  message_format<char> *pmVar2;
  locale lStack_28;
  
  std::locale::locale(&lStack_28,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  pmVar2 = std::use_facet<booster::locale::message_format<char>>(&lStack_28);
  (**(code **)(*(long *)pmVar2 + 0x20))(pmVar2,dom);
  std::locale::~locale(&lStack_28);
  iVar1 = booster::locale::ios_info::get((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  booster::locale::ios_info::domain_id(iVar1);
  return out;
}

Assistant:

std::basic_ostream<CharType> &operator<<(std::basic_ostream<CharType> &out, set_domain const &dom)
                {
                    int id = std::use_facet<message_format<CharType> >(out.getloc()).domain(dom.domain_id);
                    ios_info::get(out).domain_id(id);
                    return out;
                }